

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O2

Token __thiscall
trieste::wf::Gen::choose
          (Gen *this,vector<trieste::Token,_std::allocator<trieste::Token>_> *tokens,size_t depth)

{
  __normal_iterator<const_trieste::Token_*,_std::vector<trieste::Token,_std::allocator<trieste::Token>_>_>
  __first;
  __normal_iterator<const_trieste::Token_*,_std::vector<trieste::Token,_std::allocator<trieste::Token>_>_>
  __last;
  pointer pTVar1;
  result_type rVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var3;
  TokenDef *pTVar4;
  anon_class_16_2_f7aa0bb0 __unary_op;
  vector<double,_std::allocator<double>_> offsets;
  double value;
  _Vector_base<double,_std::allocator<double>_> local_38;
  size_t local_20;
  double local_18;
  
  __first._M_current =
       (tokens->super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (tokens->super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if ((long)__last._M_current - (long)__first._M_current == 8) {
    pTVar4 = (__first._M_current)->def;
  }
  else {
    local_20 = depth;
    if (this->target_depth < depth) {
      local_38._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
      local_38._M_impl.super__Vector_impl_data._M_finish = (double *)0x0;
      local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __unary_op.depth = &local_20;
      __unary_op.this = this;
      std::
      transform<__gnu_cxx::__normal_iterator<trieste::Token_const*,std::vector<trieste::Token,std::allocator<trieste::Token>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>,trieste::wf::Gen::choose(std::vector<trieste::Token,std::allocator<trieste::Token>>const&,unsigned_long)::_lambda(trieste::Token_const&)_1_>
                (__first,__last,(vector<double,_std::allocator<double>_> *)&local_38,__unary_op);
      std::
      partial_sum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 local_38._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 local_38._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 local_38._M_impl.super__Vector_impl_data._M_start);
      rVar2 = xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>::
              operator()(&this->rand);
      local_18 = ((double)rVar2 / 4294967295.0) *
                 local_38._M_impl.super__Vector_impl_data._M_finish[-1];
      _Var3 = std::
              __lower_bound<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,__gnu_cxx::__ops::_Iter_less_val>
                        (local_38._M_impl.super__Vector_impl_data._M_start);
      pTVar4 = *(TokenDef **)
                ((long)_Var3._M_current +
                ((long)(tokens->super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>)
                       ._M_impl.super__Vector_impl_data._M_start -
                (long)local_38._M_impl.super__Vector_impl_data._M_start));
      CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
    }
    else {
      rVar2 = xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>::
              operator()(&this->rand);
      pTVar1 = (tokens->super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pTVar4 = pTVar1[(ulong)rVar2 %
                      (ulong)((long)(tokens->
                                    super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 3)
                     ].def;
    }
  }
  return (Token)pTVar4;
}

Assistant:

Token choose(const std::vector<Token>& tokens, std::size_t depth)
      {
        if (tokens.size() == 1)
        {
          return tokens[0];
        }

        if (depth <= target_depth)
        {
          std::size_t choice = rand() % tokens.size();
          return tokens[choice];
        }

        // compute 1 / (1 + alpha * (depth - target_depth) * distance)
        std::vector<double> offsets;
        std::transform(
          tokens.begin(),
          tokens.end(),
          std::back_inserter(offsets),
          [&](const Token& t) {
            if (
              token_terminal_distance.find(t) != token_terminal_distance.end())
            {
              std::size_t distance = token_terminal_distance.at(t);
              return 1.0 / (1.0 + (alpha * (depth - target_depth) * distance));
            }
            else
            {
              std::ostringstream err;
              err << "Token " << t.str()
                  << " not found in token_terminal_distance map" << std::endl;
              err << "{";
              std::string delim = "";
              for (auto const& [key, val] : token_terminal_distance)
              {
                err << delim << key.str() << ":" << val;
                delim = ", ";
              }
              err << "}" << std::endl;
              throw std::runtime_error(err.str());
            }
          });

        // compute the cumulative distribution of P(d | c, p)
        std::partial_sum(offsets.begin(), offsets.end(), offsets.begin());

        // instead of normalizing the cumulative distribution, scale the random
        // number to the sum of the probabilities
        double value = static_cast<double>(rand() - rand.min()) /
          static_cast<double>(rand.max() - rand.min()) * offsets.back();

        // finding the first element greater than the uniform random number is
        // the same as performing a weighted sampling of the P(c | d, p)
        // distribution
        auto it = std::lower_bound(offsets.begin(), offsets.end(), value);

        return tokens[std::distance(offsets.begin(), it)];
      }